

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::socks5_stream::async_connect<libtorrent::aux::peer_connection::start()::__0>
          (socks5_stream *this,endpoint_type *endpoint,anon_class_16_1_898a5c2a *handler)

{
  string_view host;
  pointer __str;
  anon_class_16_1_898a5c2a *u;
  undefined1 auVar1 [16];
  __0 local_88 [16];
  socks5_stream *local_78;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:152:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_70;
  array<char,_22UL> local_56;
  string_view local_40;
  anon_class_16_1_898a5c2a *local_30;
  char *local_28;
  anon_class_16_1_898a5c2a *local_20;
  anon_class_16_1_898a5c2a *handler_local;
  endpoint_type *endpoint_local;
  socks5_stream *this_local;
  
  local_20 = handler;
  handler_local = (anon_class_16_1_898a5c2a *)endpoint;
  endpoint_local = (endpoint_type *)this;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
            (&(this->super_proxy_base).m_remote_endpoint.super_basic_endpoint<boost::asio::ip::tcp>,
             endpoint);
  auVar1 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)&(this->super_proxy_base).m_hostname);
  local_28 = auVar1._8_8_;
  u = auVar1._0_8_;
  local_30 = u;
  libtorrent::aux::to_string(&local_56,(long)(this->super_proxy_base).m_port);
  __str = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_56);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,__str);
  local_78 = this;
  libtorrent::aux::peer_connection::start()::$_0::__0(local_88,handler);
  libtorrent::aux::
  wrap_allocator<libtorrent::socks5_stream::async_connect<libtorrent::aux::peer_connection::start()::__0>(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
            (&local_70,(aux *)local_78,(socks5_stream *)local_88,u);
  host._M_str = local_28;
  host._M_len = (size_t)local_30;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<libtorrent::aux::wrap_allocator_t<libtorrent::socks5_stream::async_connect<libtorrent::aux::peer_connection::start()::__0>(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&(this->super_proxy_base).m_resolver,host,local_40,&local_70);
  libtorrent::aux::
  wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/socks5_stream.hpp:152:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
  ::~wrap_allocator_t(&local_70);
  libtorrent::aux::peer_connection::start()::$_0::~__0(local_88);
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler handler)
	{
		// make sure we don't try to connect to INADDR_ANY. binding is fine,
		// and using a hostname is fine on SOCKS version 5.
		TORRENT_ASSERT(endpoint.address() != address()
			|| (!m_dst_name.empty() && m_version == 5));

		m_remote_endpoint = endpoint;

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to proxy server
		// 3. if version == 5:
		//   3.1 send SOCKS5 authentication method message
		//   3.2 read SOCKS5 authentication response
		//   3.3 send username+password
		// 4. send SOCKS command message

		ADD_OUTSTANDING_ASYNC("socks5_stream::name_lookup");
		m_resolver.async_resolve(m_hostname, aux::to_string(m_port).data(), aux::wrap_allocator(
			[this](error_code const& ec, tcp::resolver::results_type ips, Handler hn) {
				name_lookup(ec, std::move(ips), std::move(hn));
			}, std::move(handler)));
	}